

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_> *
__thiscall cmGeneratorTarget::GetAllConfigSources(cmGeneratorTarget *this)

{
  if ((this->AllConfigSources).
      super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->AllConfigSources).
      super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ComputeAllConfigSources(this);
  }
  return &this->AllConfigSources;
}

Assistant:

std::vector<cmGeneratorTarget::AllConfigSource> const&
cmGeneratorTarget::GetAllConfigSources() const
{
  if (this->AllConfigSources.empty()) {
    this->ComputeAllConfigSources();
  }
  return this->AllConfigSources;
}